

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  char *__dest;
  char *pcVar1;
  
  (this->Buf).Size = 0;
  (this->Buf).Capacity = 0;
  (this->Buf).Data = (char *)0x0;
  __dest = (char *)ImGui::MemAlloc(8);
  pcVar1 = (this->Buf).Data;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    memcpy(__dest,pcVar1,(long)(this->Buf).Size);
    pcVar1 = (this->Buf).Data;
  }
  ImGui::MemFree(pcVar1);
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = 8;
  __dest[(this->Buf).Size] = '\0';
  (this->Buf).Size = (this->Buf).Size + 1;
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }